

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

int cmcmd::HashSumFile(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,Algo algo)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  ostream *poVar6;
  allocator local_a9;
  string local_a8;
  undefined1 local_88 [8];
  string value;
  allocator local_51;
  string local_50;
  char *local_30;
  char *filename;
  size_type cc;
  int retval;
  Algo algo_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  cc._4_4_ = algo;
  _retval = args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 3) {
    args_local._4_4_ = -1;
  }
  else {
    cc._0_4_ = 0;
    filename = (char *)0x2;
    while( true ) {
      pcVar4 = filename;
      pcVar3 = (char *)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(_retval);
      if (pcVar3 <= pcVar4) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](_retval,(size_type)filename);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_30 = pcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_50,pcVar4,&local_51);
      bVar1 = cmsys::SystemTools::FileIsDirectory(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      pcVar4 = local_30;
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error: ");
        poVar6 = std::operator<<(poVar6,local_30);
        poVar6 = std::operator<<(poVar6," is a directory");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        cc._0_4_ = (int)cc + 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a8,pcVar4,&local_a9);
        cmSystemTools::ComputeFileHash((string *)local_88,&local_a8,cc._4_4_);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          poVar6 = std::operator<<((ostream *)&std::cout,(string *)local_88);
          poVar6 = std::operator<<(poVar6,"  ");
          poVar6 = std::operator<<(poVar6,local_30);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cerr,local_30);
          poVar6 = std::operator<<(poVar6,": No such file or directory");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          cc._0_4_ = (int)cc + 1;
        }
        std::__cxx11::string::~string((string *)local_88);
      }
      filename = filename + 1;
    }
    args_local._4_4_ = (int)cc;
  }
  return args_local._4_4_;
}

Assistant:

int cmcmd::HashSumFile(std::vector<std::string>& args, cmCryptoHash::Algo algo)
{
  if (args.size() < 3) {
    return -1;
  }
  int retval = 0;

  for (std::string::size_type cc = 2; cc < args.size(); cc++) {
    const char* filename = args[cc].c_str();
    // Cannot compute sum of a directory
    if (cmSystemTools::FileIsDirectory(filename)) {
      std::cerr << "Error: " << filename << " is a directory" << std::endl;
      retval++;
    } else {
      std::string value = cmSystemTools::ComputeFileHash(filename, algo);
      if (value.empty()) {
        // To mimic "md5sum/shasum" behavior in a shell:
        std::cerr << filename << ": No such file or directory" << std::endl;
        retval++;
      } else {
        std::cout << value << "  " << filename << std::endl;
      }
    }
  }
  return retval;
}